

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O3

void __thiscall internalJSONNode::Set(internalJSONNode *this,bool val)

{
  byte extraout_AL;
  byte extraout_AL_00;
  byte bVar1;
  undefined7 in_register_00000031;
  undefined1 *puVar2;
  
  this->_type = '\x03';
  (this->_value)._bool = val;
  if ((int)CONCAT71(in_register_00000031,val) == 0) {
    puVar2 = &jsonSingletonCONST_FALSE::getValue[abi:cxx11]()::single;
    if (jsonSingletonCONST_FALSE::getValue[abi:cxx11]()::single != '\0') goto LAB_001194e6;
    Set();
    bVar1 = extraout_AL_00;
  }
  else {
    puVar2 = &jsonSingletonCONST_TRUE::getValue[abi:cxx11]()::single;
    if (jsonSingletonCONST_TRUE::getValue[abi:cxx11]()::single != '\0') goto LAB_001194e6;
    Set();
    bVar1 = extraout_AL;
  }
  if ((bVar1 & 1) == 0) {
    __cxa_guard_release(puVar2);
  }
LAB_001194e6:
  std::__cxx11::string::_M_assign((string *)&this->_string);
  this->fetched = true;
  return;
}

Assistant:

void internalJSONNode::Set(bool val) json_nothrow {
    makeNotContainer();
    _type = JSON_BOOL;
    _value._bool = val;
    #if(defined(JSON_CASTABLE) || !defined(JSON_LESS_MEMORY) || defined(JSON_WRITE_PRIORITY))
	   _string = val ? json_global(CONST_TRUE) : json_global(CONST_FALSE);
    #endif
    SetFetched(true);
}